

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode ssl_cf_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  undefined8 uVar1;
  curl_trc_feat *pcVar2;
  byte bVar3;
  CURLcode CVar4;
  
  *done = true;
  if ((cf->field_0x24 & 2) != 0) {
    return CURLE_OK;
  }
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
  *(Curl_easy **)((long)cf->ctx + 0x38) = data;
  CVar4 = (*Curl_ssl->shut_down)(cf,data,true,done);
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar2 = (data->state).feat;
    if (pcVar2 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) goto LAB_00173122;
    }
    else if ((cf == (Curl_cfilter *)0x0) || (pcVar2->log_level < 1)) goto LAB_00173122;
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"cf_shutdown -> %d, done=%d",(ulong)CVar4,(ulong)*done);
    }
  }
LAB_00173122:
  *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
  bVar3 = 2;
  if (CVar4 == CURLE_OK) {
    bVar3 = *done * '\x02';
  }
  cf->field_0x24 = cf->field_0x24 & 0xfd | bVar3;
  return CVar4;
}

Assistant:

static CURLcode ssl_cf_shutdown(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                bool *done)
{
  CURLcode result = CURLE_OK;

  *done = TRUE;
  if(!cf->shutdown) {
    struct cf_call_data save;

    CF_DATA_SAVE(save, cf, data);
    result = Curl_ssl->shut_down(cf, data, TRUE, done);
    CURL_TRC_CF(data, cf, "cf_shutdown -> %d, done=%d", result, *done);
    CF_DATA_RESTORE(cf, save);
    cf->shutdown = (result || *done);
  }
  return result;
}